

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O2

uint32_t farmhash32_cc(char *s,size_t len)

{
  int *piVar1;
  int *piVar2;
  uint *puVar3;
  uint32_t a;
  uint32_t a_00;
  uint32_t a_01;
  uint uVar4;
  int iVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  ulong uVar8;
  size_t sVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  
  uVar7 = (uint32_t)len;
  if (0x18 < len) {
    uVar11 = (*(int *)(s + (len - 4)) * 0x16a88000 |
             (uint)(*(int *)(s + (len - 4)) * -0x3361d2af) >> 0x11) * 0x1b873593 ^ uVar7;
    uVar4 = (*(int *)(s + (len - 8)) * 0x16a88000 |
            (uint)(*(int *)(s + (len - 8)) * -0x3361d2af) >> 0x11) * 0x1b873593 ^
            uVar7 * -0x3361d2af;
    uVar12 = (uVar11 >> 0x13 | uVar11 << 0xd) * 5 + 0xe6546b64 ^
             (*(int *)(s + (len - 0x10)) * 0x16a88000 |
             (uint)(*(int *)(s + (len - 0x10)) * -0x3361d2af) >> 0x11) * 0x1b873593;
    uVar11 = (uVar4 >> 0x13 | uVar4 << 0xd) * 5 + 0xe6546b64 ^
             (*(int *)(s + (len - 0xc)) * 0x16a88000 |
             (uint)(*(int *)(s + (len - 0xc)) * -0x3361d2af) >> 0x11) * 0x1b873593;
    uVar4 = (uVar12 >> 0x13 | uVar12 << 0xd) * 5 + 0xe6546b64;
    uVar14 = (*(int *)(s + (len - 0x14)) * 0x16a88000 |
             (uint)(*(int *)(s + (len - 0x14)) * -0x3361d2af) >> 0x11) * 0x1b873593 +
             uVar7 * -0x3361d2af;
    uVar12 = (uVar11 >> 0x13 | uVar11 << 0xd) * 5 + 0xe6546b64;
    uVar11 = (uVar14 >> 0x13 | uVar14 * 0x2000) * 5 + 0xe6546b64;
    uVar8 = (len - 1) / 0x14;
    do {
      piVar1 = (int *)((long)s + 4);
      uVar13 = uVar11 + *piVar1;
      uVar10 = (*(int *)s * 0x16a88000 | (uint)(*(int *)s * -0x3361d2af) >> 0x11) * 0x1b873593;
      uVar4 = uVar4 ^ uVar10;
      uVar12 = (*(int *)((long)s + 8) * 0x16a88000 |
               (uint)(*(int *)((long)s + 8) * -0x3361d2af) >> 0x11) * 0x1b873593 + uVar12;
      piVar2 = (int *)((long)s + 0xc);
      puVar3 = (uint *)((long)s + 0x10);
      s = (char *)((long)s + 0x14);
      uVar4 = (*piVar2 * 0x16a88000 | (uint)(*piVar2 * -0x3361d2af) >> 0x11) * 0x1b873593 + *piVar1
              ^ (uVar4 >> 0x12 | uVar4 << 0xe) * 5 + 0xe6546b64;
      uVar11 = (uVar12 >> 0x12 | uVar12 * 0x4000) * 5 + 0xe6546b64 ^ *puVar3;
      uVar14 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8;
      uVar11 = (uVar14 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18) * 5;
      uVar12 = ((uVar4 >> 0x13 | uVar4 << 0xd) + *puVar3) * 5 + 0xe6546b64;
      uVar4 = (uVar13 >> 0x13 | uVar13 * 0x2000) * -0x3361d2af + uVar10;
      uVar10 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8;
      uVar12 = uVar10 | (uVar12 & 0xff00) << 8 | uVar12 * 0x1000000;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
    uVar4 = ((uVar12 >> 0xb) * 0x16a88000 | (uVar12 >> 0xb | uVar10 << 0x15) * -0x3361d2af >> 0x11)
            * -0x3361d2af + uVar4;
    uVar4 = (uVar4 >> 0x13 | uVar4 * 0x2000) * 5 + 0xe6546b64;
    iVar5 = (uVar4 >> 0x11 | uVar4 * 0x8000) +
            ((uVar11 >> 0xb) * 0x16a88000 |
            (uVar14 * 0xa00000 | uVar11 >> 0xb) * -0x3361d2af >> 0x11);
    uVar11 = (iVar5 * -0x3a55e000 | (uint)(iVar5 * -0x3361d2af) >> 0x13) * 5 + 0xe6546b64;
    return (uVar11 >> 0x11 | uVar11 * 0x8000) * -0x3361d2af;
  }
  if (len < 0xd) {
    if (4 < len) {
      iVar5 = *(int *)(s + (len - 4));
      uVar11 = *(int *)(s + (ulong)(uVar7 >> 3 & 1) * 4) + 9;
      uVar6 = mur(*(int *)s + uVar7,uVar7 * 5);
      uVar7 = mur(iVar5 + uVar7 * 5,uVar6);
      goto LAB_0017825e;
    }
    uVar4 = 9;
    uVar11 = 0;
    for (sVar9 = 0; len != sVar9; sVar9 = sVar9 + 1) {
      uVar11 = uVar11 * -0x3361d2af + (int)s[sVar9];
      uVar4 = uVar4 ^ uVar11;
    }
  }
  else {
    uVar6 = *(uint32_t *)s;
    a = *(uint32_t *)(s + 4);
    a_00 = *(uint32_t *)(s + (len - 8));
    uVar11 = *(uint *)(s + (len - 4));
    a_01 = *(uint32_t *)(s + (len >> 1));
    uVar7 = mur(*(uint32_t *)(s + ((len >> 1) - 4)),uVar7);
    uVar7 = mur(a,uVar7);
    uVar7 = mur(a_00,uVar7);
    uVar4 = mur(a_01,uVar7);
    uVar7 = uVar6;
  }
  uVar7 = mur(uVar7,uVar4);
LAB_0017825e:
  uVar7 = mur(uVar11,uVar7);
  uVar7 = fmix(uVar7);
  return uVar7;
}

Assistant:

uint32_t farmhash32_cc(const char *s, size_t len) {
  if (len <= 24) {
    return len <= 12 ?
        (len <= 4 ? farmhash32_cc_len_0_to_4(s, len) : farmhash32_cc_len_5_to_12(s, len)) :
        farmhash32_cc_len_13_to_24(s, len);
  }

  // len > 24
  uint32_t h = len, g = c1 * len, f = g;
  uint32_t a0 = ror32(fetch32(s + len - 4) * c1, 17) * c2;
  uint32_t a1 = ror32(fetch32(s + len - 8) * c1, 17) * c2;
  uint32_t a2 = ror32(fetch32(s + len - 16) * c1, 17) * c2;
  uint32_t a3 = ror32(fetch32(s + len - 12) * c1, 17) * c2;
  uint32_t a4 = ror32(fetch32(s + len - 20) * c1, 17) * c2;
  h ^= a0;
  h = ror32(h, 19);
  h = h * 5 + 0xe6546b64;
  h ^= a2;
  h = ror32(h, 19);
  h = h * 5 + 0xe6546b64;
  g ^= a1;
  g = ror32(g, 19);
  g = g * 5 + 0xe6546b64;
  g ^= a3;
  g = ror32(g, 19);
  g = g * 5 + 0xe6546b64;
  f += a4;
  f = ror32(f, 19);
  f = f * 5 + 0xe6546b64;
  size_t iters = (len - 1) / 20;
  do {
    uint32_t a0 = ror32(fetch32(s) * c1, 17) * c2;
    uint32_t a1 = fetch32(s + 4);
    uint32_t a2 = ror32(fetch32(s + 8) * c1, 17) * c2;
    uint32_t a3 = ror32(fetch32(s + 12) * c1, 17) * c2;
    uint32_t a4 = fetch32(s + 16);
    h ^= a0;
    h = ror32(h, 18);
    h = h * 5 + 0xe6546b64;
    f += a1;
    f = ror32(f, 19);
    f = f * c1;
    g += a2;
    g = ror32(g, 18);
    g = g * 5 + 0xe6546b64;
    h ^= a3 + a1;
    h = ror32(h, 19);
    h = h * 5 + 0xe6546b64;
    g ^= a4;
    g = bswap32(g) * 5;
    h += a4 * 5;
    h = bswap32(h);
    f += a0;
    PERMUTE3(&f, &h, &g);
    s += 20;
  } while (--iters != 0);
  g = ror32(g, 11) * c1;
  g = ror32(g, 17) * c1;
  f = ror32(f, 11) * c1;
  f = ror32(f, 17) * c1;
  h = ror32(h + g, 19);
  h = h * 5 + 0xe6546b64;
  h = ror32(h, 17) * c1;
  h = ror32(h + f, 19);
  h = h * 5 + 0xe6546b64;
  h = ror32(h, 17) * c1;
  return h;
}